

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_repair(REF_GRID ref_grid)

{
  undefined1 (*pauVar1) [16];
  int *piVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  undefined1 auVar8 [16];
  void *pvVar9;
  uint uVar10;
  int iVar11;
  REF_STATUS RVar12;
  void *__ptr;
  long lVar13;
  REF_CELL *ppRVar14;
  undefined8 uVar15;
  long lVar16;
  REF_STATUS ref_private_macro_code_rss;
  long lVar17;
  char *pcVar18;
  long lVar19;
  REF_FACE pRVar20;
  int iVar21;
  REF_GRID pRVar22;
  double dVar24;
  undefined1 auVar23 [16];
  double dVar25;
  REF_INT cell0;
  REF_INT local_19c;
  REF_INT face_nodes [4];
  REF_INT new_node;
  REF_INT nodes [4];
  REF_FACE ref_face;
  REF_INT new_cell;
  REF_INT cell1;
  REF_GRID local_158;
  REF_BOOL split_face;
  REF_CELL *local_148;
  REF_NODE local_140;
  void *local_138;
  REF_CELL *local_130;
  long local_128;
  REF_GLOB global;
  REF_INT tri_face;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT hex_nodes [27];
  
  pRVar3 = ref_grid->node;
  uVar10 = ref_face_create(&ref_face,ref_grid);
  pRVar20 = ref_face;
  if (uVar10 == 0) {
    if ((long)ref_face->n < 0) {
      pcVar18 = "malloc hits of REF_INT negative";
      uVar15 = 0x229;
LAB_001fb77f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             uVar15,"ref_validation_repair",pcVar18);
      return 1;
    }
    __ptr = malloc((long)ref_face->n << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x229,"ref_validation_repair","malloc hits of REF_INT NULL");
      return 2;
    }
    local_19c = 0;
    if (0 < pRVar20->n) {
      lVar13 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar13 * 4) = 0;
        lVar13 = lVar13 + 1;
        local_19c = (REF_INT)lVar13;
      } while (lVar13 < pRVar20->n);
    }
    local_130 = ref_grid->cell;
    ppRVar14 = ref_grid->cell + 8;
    lVar13 = 8;
    local_158 = ref_grid;
    local_148 = ppRVar14;
    local_140 = pRVar3;
    do {
      pRVar4 = *ppRVar14;
      iVar11 = pRVar4->max;
      local_128 = lVar13;
      if (0 < iVar11) {
        iVar21 = 0;
        do {
          if ((pRVar4->c2n[(long)pRVar4->size_per * (long)iVar21] != -1) && (0 < pRVar4->face_per))
          {
            lVar13 = 0;
            lVar19 = 0;
            do {
              pRVar5 = pRVar4->c2n;
              pRVar6 = pRVar4->f2n;
              lVar16 = 0;
              do {
                nodes[lVar16] =
                     pRVar5[(long)pRVar4->size_per * (long)iVar21 +
                            (long)*(int *)((long)pRVar6 + lVar16 * 4 + lVar13)];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              uVar10 = ref_face_with(ref_face,nodes,&local_19c);
              if (uVar10 != 0) {
                pcVar18 = "find cell face";
                uVar15 = 0x233;
                goto LAB_001fad88;
              }
              piVar2 = (int *)((long)__ptr + (long)local_19c * 4);
              *piVar2 = *piVar2 + 1;
              lVar19 = lVar19 + 1;
              lVar13 = lVar13 + 0x10;
            } while (lVar19 < pRVar4->face_per);
            iVar11 = pRVar4->max;
          }
          iVar21 = iVar21 + 1;
        } while (iVar21 < iVar11);
      }
      pRVar22 = local_158;
      ppRVar14 = local_130 + local_128 + 1;
      lVar13 = local_128 + 1;
    } while (lVar13 != 0x10);
    pRVar4 = local_158->cell[3];
    iVar11 = pRVar4->max;
    if (0 < iVar11) {
      iVar21 = 0;
      do {
        pRVar5 = pRVar4->c2n;
        if (pRVar5[(long)pRVar4->size_per * (long)iVar21] != -1) {
          lVar13 = 0;
          do {
            nodes[lVar13] = pRVar5[(long)pRVar4->size_per * (long)iVar21 + lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          nodes[3] = nodes[0];
          uVar10 = ref_face_with(ref_face,nodes,&local_19c);
          if (uVar10 != 0) {
            ref_node_location(pRVar22->node,nodes[0]);
            ref_node_location(pRVar22->node,nodes[1]);
            ref_node_location(pRVar22->node,nodes[2]);
            ref_node_location(pRVar22->node,nodes[3]);
            pcVar18 = "find tri";
            uVar15 = 0x246;
            goto LAB_001fad88;
          }
          piVar2 = (int *)((long)__ptr + (long)local_19c * 4);
          *piVar2 = *piVar2 + 1;
          iVar11 = pRVar4->max;
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 < iVar11);
    }
    pRVar4 = pRVar22->cell[6];
    iVar11 = pRVar4->max;
    if (0 < iVar11) {
      iVar21 = 0;
      do {
        pRVar5 = pRVar4->c2n;
        if (pRVar5[(long)pRVar4->size_per * (long)iVar21] != -1) {
          lVar13 = 0;
          do {
            nodes[lVar13] = pRVar5[(long)pRVar4->size_per * (long)iVar21 + lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          uVar10 = ref_face_with(ref_face,nodes,&local_19c);
          if (uVar10 != 0) {
            pcVar18 = "find qua";
            uVar15 = 0x24f;
            goto LAB_001fad88;
          }
          piVar2 = (int *)((long)__ptr + (long)local_19c * 4);
          *piVar2 = *piVar2 + 1;
          iVar11 = pRVar4->max;
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 < iVar11);
    }
    local_19c = 0;
    pRVar20 = ref_face;
    pvVar9 = __ptr;
    if (0 < ref_face->n) {
      do {
        local_138 = pvVar9;
        iVar11 = *(int *)((long)__ptr + (long)local_19c * 4);
        if (pRVar22->mpi->n < 2) {
LAB_001fb053:
          if (iVar11 != 2) {
LAB_001fb05c:
            printf(" hits %d\n");
            pRVar5 = ref_face->f2n;
            lVar13 = 0;
            do {
              nodes[lVar13] = pRVar5[(long)local_19c * 4 + lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n");
            uVar10 = ref_node_location(pRVar22->node,nodes[0]);
            if (uVar10 != 0) {
              pcVar18 = "n0";
              uVar15 = 0x26c;
              goto LAB_001fad88;
            }
            uVar10 = ref_node_location(pRVar22->node,nodes[1]);
            if (uVar10 != 0) {
              pcVar18 = "n1";
              uVar15 = 0x26d;
              goto LAB_001fad88;
            }
            uVar10 = ref_node_location(pRVar22->node,nodes[2]);
            if (uVar10 != 0) {
              pcVar18 = "n2";
              uVar15 = 0x26e;
              goto LAB_001fad88;
            }
            uVar10 = ref_node_location(pRVar22->node,nodes[3]);
            if (uVar10 != 0) {
              pcVar18 = "n3";
              uVar15 = 0x26f;
              goto LAB_001fad88;
            }
            if (nodes[0] != nodes[3]) {
              pRVar4 = pRVar22->cell[0xb];
              puts("have quad");
              uVar10 = ref_cell_with_face(pRVar4,nodes,&cell0,&cell1);
              if (uVar10 != 0) {
                pcVar18 = "hex";
                uVar15 = 0x277;
                goto LAB_001fad88;
              }
              printf("hexes %d %d\n",(ulong)(uint)cell0,(ulong)(uint)cell1);
              if (cell0 == -1) {
                pcVar18 = "cant find hex";
                uVar15 = 0x279;
                goto LAB_001fb77f;
              }
              if ((long)cell1 != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x27a,"ref_validation_repair","found 2 hex",0xffffffffffffffff,(long)cell1);
                return 1;
              }
              uVar10 = ref_cell_nodes(pRVar4,cell0,hex_nodes);
              pRVar3 = local_140;
              if (uVar10 != 0) {
                pcVar18 = "hex";
                uVar15 = 0x27b;
                goto LAB_001fad88;
              }
              uVar10 = ref_node_next_global(local_140,&global);
              if (uVar10 != 0) {
                pcVar18 = "next global";
                uVar15 = 0x27c;
                goto LAB_001fad88;
              }
              uVar10 = ref_node_add(pRVar3,global,&new_node);
              if (uVar10 != 0) {
                pcVar18 = "new node";
                uVar15 = 0x27d;
                goto LAB_001fad88;
              }
              pRVar7 = pRVar3->real;
              lVar13 = (long)new_node;
              pauVar1 = (undefined1 (*) [16])(pRVar7 + lVar13 * 0xf);
              auVar23 = ZEXT816(0);
              *(undefined1 (*) [16])(pRVar7 + lVar13 * 0xf) = auVar23;
              pRVar7[lVar13 * 0xf + 2] = 0.0;
              iVar11 = pRVar4->node_per;
              dVar25 = 0.0;
              if (0 < (long)iVar11) {
                lVar13 = 0;
                do {
                  iVar21 = hex_nodes[lVar13];
                  dVar24 = auVar23._8_8_;
                  auVar23._0_8_ = auVar23._0_8_ + pRVar7[(long)iVar21 * 0xf];
                  auVar23._8_8_ = dVar24 + (pRVar7 + (long)iVar21 * 0xf)[1];
                  *pauVar1 = auVar23;
                  dVar25 = dVar25 + pRVar7[(long)iVar21 * 0xf + 2];
                  *(double *)pauVar1[1] = dVar25;
                  lVar13 = lVar13 + 1;
                } while (iVar11 != lVar13);
              }
              dVar24 = (double)iVar11;
              auVar8._8_4_ = SUB84(dVar24,0);
              auVar8._0_8_ = dVar24;
              auVar8._12_4_ = (int)((ulong)dVar24 >> 0x20);
              auVar23 = divpd(auVar23,auVar8);
              *pauVar1 = auVar23;
              *(double *)pauVar1[1] = dVar25 / dVar24;
              if (0 < pRVar4->face_per) {
                lVar19 = 0;
                lVar13 = 0;
                do {
                  pRVar5 = pRVar4->f2n;
                  pRVar6 = pRVar4->c2n;
                  lVar16 = (long)pRVar4->size_per * (long)cell0;
                  face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                  lVar16 = (long)(int)lVar16;
                  face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 4) + lVar16];
                  face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 8) + lVar16];
                  face_nodes[3] =
                       pRVar6[(long)pRVar4->size_per * (long)cell0 +
                              (long)*(int *)((long)pRVar5 + lVar19 + 0xc)];
                  uVar10 = ref_sort_same(4,nodes,face_nodes,&split_face);
                  if (uVar10 != 0) {
                    pcVar18 = "same";
                    uVar15 = 0x298;
                    goto LAB_001fad88;
                  }
                  if (split_face == 0) {
                    pRVar5 = pRVar4->f2n;
                    pRVar6 = pRVar4->c2n;
                    lVar17 = (long)cell0;
                    lVar16 = pRVar4->size_per * lVar17;
                    tri_face = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                    local_10c = pRVar6[(long)(int)lVar16 + (long)*(int *)((long)pRVar5 + lVar19 + 4)
                                      ];
                    local_108 = pRVar6[pRVar4->size_per * lVar17 +
                                       (long)*(int *)((long)pRVar5 + lVar19 + 8)];
                    local_114 = pRVar6[pRVar4->size_per * lVar17 +
                                       (long)*(int *)((long)pRVar5 + lVar19 + 0xc)];
                    local_110 = new_node;
                    uVar10 = ref_cell_add(pRVar22->cell[9],&tri_face,&new_cell);
                    if (uVar10 != 0) {
                      pcVar18 = "pyr";
                      uVar15 = 0x2c7;
                      goto LAB_001fad88;
                    }
                  }
                  else {
                    pRVar5 = pRVar4->f2n;
                    pRVar6 = pRVar4->c2n;
                    lVar16 = (long)cell0 * (long)pRVar4->size_per;
                    face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                    lVar16 = (long)(int)lVar16;
                    face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 4) + lVar16];
                    face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 8) + lVar16];
                    face_nodes[3] = face_nodes[0];
                    RVar12 = ref_face_with(ref_face,face_nodes,&tri_face);
                    ppRVar14 = local_148;
                    if (RVar12 == 0) {
                      pRVar5 = pRVar4->f2n;
                      pRVar6 = pRVar4->c2n;
                      lVar16 = (long)cell0 * (long)pRVar4->size_per;
                      face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                      lVar16 = (long)(int)lVar16;
                      face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 4) + lVar16];
                      face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 8) + lVar16];
                      face_nodes[3] = new_node;
                      uVar10 = ref_cell_add(*local_148,face_nodes,&new_cell);
                      if (uVar10 != 0) {
                        pcVar18 = "tet";
                        uVar15 = 0x2a5;
                        goto LAB_001fad88;
                      }
                      pRVar5 = pRVar4->f2n;
                      pRVar6 = pRVar4->c2n;
                      lVar16 = (long)cell0 * (long)pRVar4->size_per;
                      face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                      lVar16 = (long)(int)lVar16;
                      face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 8) + lVar16];
                      face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 0xc) + lVar16];
                      face_nodes[3] = new_node;
                      uVar10 = ref_cell_add(*ppRVar14,face_nodes,&new_cell);
                      pRVar22 = local_158;
                      if (uVar10 != 0) {
                        pcVar18 = "tet";
                        uVar15 = 0x2ab;
                        goto LAB_001fad88;
                      }
                    }
                    pRVar5 = pRVar4->f2n;
                    pRVar6 = pRVar4->c2n;
                    lVar16 = (long)cell0 * (long)pRVar4->size_per;
                    face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                    lVar16 = (long)(int)lVar16;
                    face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 4) + lVar16];
                    face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 0xc) + lVar16];
                    face_nodes[3] = face_nodes[0];
                    RVar12 = ref_face_with(ref_face,face_nodes,&tri_face);
                    ppRVar14 = local_148;
                    if (RVar12 == 0) {
                      pRVar5 = pRVar4->f2n;
                      pRVar6 = pRVar4->c2n;
                      lVar16 = (long)cell0 * (long)pRVar4->size_per;
                      face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19) + lVar16];
                      lVar16 = (long)(int)lVar16;
                      face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 4) + lVar16];
                      face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 0xc) + lVar16];
                      face_nodes[3] = new_node;
                      uVar10 = ref_cell_add(*local_148,face_nodes,&new_cell);
                      if (uVar10 != 0) {
                        pcVar18 = "tet";
                        uVar15 = 0x2b7;
                        goto LAB_001fad88;
                      }
                      pRVar5 = pRVar4->f2n;
                      pRVar6 = pRVar4->c2n;
                      lVar16 = (long)cell0 * (long)pRVar4->size_per;
                      face_nodes[0] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 4) + lVar16];
                      lVar16 = (long)(int)lVar16;
                      face_nodes[1] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 8) + lVar16];
                      face_nodes[2] = pRVar6[*(int *)((long)pRVar5 + lVar19 + 0xc) + lVar16];
                      face_nodes[3] = new_node;
                      uVar10 = ref_cell_add(*ppRVar14,face_nodes,&new_cell);
                      pRVar22 = local_158;
                      if (uVar10 != 0) {
                        pcVar18 = "tet";
                        uVar15 = 0x2bd;
                        goto LAB_001fad88;
                      }
                    }
                  }
                  lVar13 = lVar13 + 1;
                  lVar19 = lVar19 + 0x10;
                } while (lVar13 < pRVar4->face_per);
              }
              uVar10 = ref_cell_remove(pRVar22->cell[0xb],cell0);
              __ptr = local_138;
              if (uVar10 != 0) {
                pcVar18 = "hex";
                uVar15 = 0x2ca;
                goto LAB_001fad88;
              }
            }
          }
        }
        else {
          pRVar5 = local_140->part;
          iVar21 = local_140->ref_mpi->id;
          pRVar6 = ref_face->f2n;
          uVar10 = local_19c << 2;
          if (((iVar21 == pRVar5[pRVar6[(int)uVar10]]) ||
              (iVar21 == pRVar5[pRVar6[(int)(uVar10 | 1)]])) ||
             (iVar21 == pRVar5[pRVar6[(int)(uVar10 | 2)]])) goto LAB_001fb053;
          if ((iVar21 != pRVar5[pRVar6[(int)(uVar10 | 3)]]) || (2 < iVar11)) {
            if ((iVar21 != pRVar5[pRVar6[(int)(uVar10 | 3)]]) && (iVar11 < 3)) goto LAB_001fb6eb;
            goto LAB_001fb05c;
          }
          if (iVar11 < 2) goto LAB_001fb05c;
        }
LAB_001fb6eb:
        local_19c = local_19c + 1;
        pRVar20 = ref_face;
        pvVar9 = local_138;
      } while (local_19c < ref_face->n);
    }
    free(__ptr);
    uVar10 = ref_face_free(pRVar20);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar18 = "face free";
    uVar15 = 0x2d1;
  }
  else {
    pcVar18 = "face";
    uVar15 = 0x227;
  }
LAB_001fad88:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar15,"ref_validation_repair",(ulong)uVar10,pcVar18);
  return uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_validation_repair(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL report;
  REF_STATUS code;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    RSS(ref_face_with(ref_face, nodes, &face), "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
      if (nodes[0] != nodes[3]) {
        REF_INT cell0, cell1;
        REF_INT hex_nodes[REF_CELL_MAX_SIZE_PER];
        REF_GLOB global;
        REF_INT new_node, cell_node;
        ref_cell = ref_grid_hex(ref_grid);
        printf("have quad\n");
        RSS(ref_cell_with_face(ref_cell, nodes, &cell0, &cell1), "hex");
        printf("hexes %d %d\n", cell0, cell1);
        RUS(REF_EMPTY, cell0, "cant find hex");
        REIS(REF_EMPTY, cell1, "found 2 hex");
        RSS(ref_cell_nodes(ref_cell, cell0, hex_nodes), "hex");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        ref_node_xyz(ref_node, 0, new_node) = 0.0;
        ref_node_xyz(ref_node, 1, new_node) = 0.0;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
        each_ref_cell_cell_node(ref_cell, cell_node) {
          ref_node_xyz(ref_node, 0, new_node) +=
              ref_node_xyz(ref_node, 0, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 1, new_node) +=
              ref_node_xyz(ref_node, 1, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 2, new_node) +=
              ref_node_xyz(ref_node, 2, hex_nodes[cell_node]);
        }
        ref_node_xyz(ref_node, 0, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 1, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 2, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        each_ref_cell_cell_face(ref_cell, cell_face) {
          REF_INT face_nodes[4];
          REF_BOOL split_face;
          REF_INT new_cell;

          face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
          face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
          face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
          face_nodes[3] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
          RSS(ref_sort_same(4, nodes, face_nodes, &split_face), "same");
          if (split_face) {
            REF_INT tri_face;
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
          } else {
            REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
            pyr_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            pyr_nodes[3] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            pyr_nodes[4] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            pyr_nodes[1] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            pyr_nodes[2] = new_node;
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
                "pyr");
          }
        }
        RSS(ref_cell_remove(ref_grid_hex(ref_grid), cell0), "hex");
      }
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return REF_SUCCESS;
}